

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O0

wchar_t hist_command(EditLine *el,wchar_t argc,wchar_t **argv)

{
  int iVar1;
  wchar_t wVar2;
  char *__s;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  wchar_t *local_98;
  wchar_t *local_90;
  wchar_t *local_88;
  wchar_t *local_80;
  char *nbuf;
  size_t len;
  char *ptr;
  char *pcStack_58;
  wchar_t hno;
  char *buf;
  size_t maxlen;
  HistEventW ev;
  wchar_t *pwStack_30;
  wchar_t num;
  wchar_t *str;
  wchar_t **argv_local;
  wchar_t argc_local;
  EditLine *el_local;
  
  if ((el->el_history).ref == (void *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else if ((argc == L'\x01') || (iVar1 = wcscmp(argv[1],anon_var_dwarf_50a5 + 6), iVar1 == 0)) {
    buf = (char *)0x0;
    pcStack_58 = (char *)0x0;
    ptr._4_4_ = 1;
    if ((el->el_flags & 0x40U) == 0) {
      wVar2 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x04',0);
      if (wVar2 == L'\xffffffff') {
        local_88 = (wchar_t *)0x0;
      }
      else {
        local_88 = (el->el_history).ev.str;
      }
      local_80 = local_88;
    }
    else {
      local_80 = hist_convert(el,L'\x04',(void *)0x0);
    }
    pwStack_30 = local_80;
    while (pwStack_30 != (wchar_t *)0x0) {
      __s = ct_encode_string(pwStack_30,&el->el_scratch);
      pcVar3 = (char *)strlen(__s);
      nbuf = pcVar3;
      if ((pcVar3 != (char *)0x0) && (__s[(long)(pcVar3 + -1)] == '\n')) {
        nbuf = pcVar3 + -1;
        (__s + -1)[(long)pcVar3] = '\0';
      }
      pcVar3 = pcStack_58;
      if (buf <= (char *)((long)nbuf * 4 + 1U)) {
        buf = (char *)((long)nbuf * 4 + 0x401);
        pcVar3 = (char *)realloc(pcStack_58,(size_t)buf);
        if (pcVar3 == (char *)0x0) {
          free(pcStack_58);
          return L'\xffffffff';
        }
      }
      pcStack_58 = pcVar3;
      strvis(pcStack_58,__s,L'\x10');
      uVar5 = (ulong)ptr._4_4_;
      ptr._4_4_ = ptr._4_4_ + 1;
      fprintf((FILE *)el->el_outfile,"%d\t%s\n",uVar5,pcStack_58);
      if ((el->el_flags & 0x40U) == 0) {
        wVar2 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x05',0);
        if (wVar2 == L'\xffffffff') {
          local_98 = (wchar_t *)0x0;
        }
        else {
          local_98 = (el->el_history).ev.str;
        }
        local_90 = local_98;
      }
      else {
        local_90 = hist_convert(el,L'\x05',(void *)0x0);
      }
      pwStack_30 = local_90;
    }
    free(pcStack_58);
    el_local._4_4_ = L'\0';
  }
  else if (argc == L'\x03') {
    lVar4 = wcstol(argv[2],(wchar_t **)0x0,0);
    ev.str._4_4_ = (uint)lVar4;
    iVar1 = wcscmp(argv[1],anon_var_dwarf_410d);
    if (iVar1 == 0) {
      el_local._4_4_ =
           history_w((HistoryW *)(el->el_history).ref,(HistEventW *)&maxlen,L'\x01',
                     (ulong)ev.str._4_4_);
    }
    else {
      iVar1 = wcscmp(argv[1],anon_var_dwarf_4117);
      if (iVar1 == 0) {
        el_local._4_4_ =
             history_w((HistoryW *)(el->el_history).ref,(HistEventW *)&maxlen,L'\x14',
                       (ulong)ev.str._4_4_);
      }
      else {
        el_local._4_4_ = L'\xffffffff';
      }
    }
  }
  else {
    el_local._4_4_ = L'\xffffffff';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
hist_command(EditLine *el, int argc, const wchar_t **argv)
{
	const wchar_t *str;
	int num;
	HistEventW ev;

	if (el->el_history.ref == NULL)
		return -1;

	if (argc == 1 || wcscmp(argv[1], L"list") == 0) {
		size_t maxlen = 0;
		char *buf = NULL;
		int hno = 1;
		 /* List history entries */

		for (str = HIST_LAST(el); str != NULL; str = HIST_PREV(el)) {
			char *ptr =
			    ct_encode_string(str, &el->el_scratch);
			size_t len = strlen(ptr);
			if (len > 0 && ptr[len - 1] == '\n') 
				ptr[--len] = '\0';
			len = len * 4 + 1;
			if (len >= maxlen) {
				maxlen = len + 1024;
				char *nbuf = el_realloc(buf, maxlen);
				if (nbuf == NULL) {
					el_free(buf);
					return -1;
				}
				buf = nbuf;
			}
			strvis(buf, ptr, VIS_NL);
			(void) fprintf(el->el_outfile, "%d\t%s\n",
			    hno++, buf);
		}
		el_free(buf);
		return 0;
	}

	if (argc != 3)
		return -1;

	num = (int)wcstol(argv[2], NULL, 0);

	if (wcscmp(argv[1], L"size") == 0)
		return history_w(el->el_history.ref, &ev, H_SETSIZE, num);

	if (wcscmp(argv[1], L"unique") == 0)
		return history_w(el->el_history.ref, &ev, H_SETUNIQUE, num);

	return -1;
}